

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O0

bool __thiscall ConfigReader::isSpecialIdentChar(ConfigReader *this,char c)

{
  char c_local;
  ConfigReader *this_local;
  
  if ((((c == '[') || (c == ']')) || (c == '<')) ||
     (((c == '>' || (c == '/')) || ((c == '\\' || (c == '.')))))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConfigReader::isSpecialIdentChar(char c) const
{
    if ((c == '[') || (c == ']') || 
        (c == '<') || (c == '>') || 
        (c == '/') || (c == '\\') ||
        (c == '.'))
    {
        return true;
    }
    return false;
}